

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

void * __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
reallocate(MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this
          ,void *ptr,size_type newUserSize)

{
  MemChunk *this_00;
  size_type __n;
  void *pvVar1;
  ulong size;
  
  if (ptr != (void *)0x0) {
    this_00 = (MemChunk *)((long)ptr + -0x10);
    __n = MemChunk::getUserSize(this_00);
    size = 0x20;
    if (0xf < newUserSize) {
      size = newUserSize + 0x1f & 0xfffffffffffffff0;
    }
    if ((__n + 0x1f & 0xfffffffffffffff0) < size) {
      pvVar1 = allocate(this,newUserSize);
      if (pvVar1 == (void *)0x0) {
        ptr = (void *)0x0;
      }
      else {
        memcpy(pvVar1,ptr,__n);
        deallocate(this,ptr,0);
        ptr = pvVar1;
      }
    }
    else {
      splitChunk(this,this_00,size);
      setUsed(this,this_00,newUserSize);
    }
    return ptr;
  }
  pvVar1 = allocate(this,newUserSize);
  return pvVar1;
}

Assistant:

T*
    reallocate (T* ptr, size_type newUserSize)
    {
        if (ptr == nullptr)
        {
            return allocate(newUserSize);
        }

        MemChunk* chunk = mem2Chunk (ptr);
        size_type oldAllocSize = chunk->getUserSize ();
        size_type oldChunkSize = calcChunkSize(oldAllocSize);

        size_type newAllocSize = newUserSize;
        size_type newChunkSize = (newAllocSize < MIN_REQUEST) ? MIN_CHUNK_SIZE : calcChunkSize(newAllocSize);

        if (oldChunkSize < newChunkSize)
        {
            // For now we use a simple algorithm that allocate new memory.
            T* newPtr = allocate (newUserSize);
            if (newPtr)
            {
                memcpy(newPtr, ptr, oldAllocSize);
                deallocate (ptr);
            }
            return newPtr;
        }
        else
        {
            m_logger.logReallocation(ptr, oldAllocSize, newUserSize);

            // simply split the chunk
            splitChunk (chunk, newChunkSize);
            setUsed (chunk, newUserSize);
            return ptr;
        }
    }